

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

bool __thiscall BigInt::LessThan(BigInt *this,BigInt *other)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar5 = this->_isNegative;
  if ((bool)bVar5 == true) {
    uVar4 = 1;
    if (other->_isNegative == false) goto LAB_001033db;
  }
  else if (other->_isNegative != false) {
    return false;
  }
  piVar2 = (this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
  piVar3 = (other->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 1;
  iVar7 = (int)uVar8;
  iVar6 = (int)((ulong)((long)(other->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
  if ((iVar6 <= iVar7) && (uVar4 = 0, iVar7 <= iVar6)) {
    uVar9 = 0;
    if (0 < iVar7) {
      uVar9 = uVar8 & 0xffffffff;
    }
    do {
      uVar8 = uVar4;
      if (uVar9 == uVar8) break;
      iVar6 = piVar2[uVar8];
      iVar1 = piVar3[uVar8];
      if (iVar6 < iVar1) {
        bVar5 = bVar5 ^ 1;
        break;
      }
      uVar4 = uVar8 + 1;
    } while (iVar6 <= iVar1);
    return (bool)((long)uVar8 < (long)iVar7 & bVar5);
  }
LAB_001033db:
  return SUB81(uVar4,0);
}

Assistant:

bool BigInt::IsNegative() const
{
    return _isNegative;
}